

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void pumpChildStdio(int childStdinFd,int childStdoutFd,int childStderrFd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  fd_set local_b0;
  
  iVar3 = childStderrFd;
  if (childStderrFd < childStdoutFd) {
    iVar3 = childStdoutFd;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  uVar5 = 1L << ((byte)childStdoutFd & 0x3f);
  uVar4 = 1L << ((byte)childStderrFd & 0x3f);
  do {
    do {
      local_b0.fds_bits[0xd] = 0;
      local_b0.fds_bits[0xe] = 0;
      local_b0.fds_bits[0xb] = 0;
      local_b0.fds_bits[0xc] = 0;
      local_b0.fds_bits[9] = 0;
      local_b0.fds_bits[10] = 0;
      local_b0.fds_bits[7] = 0;
      local_b0.fds_bits[8] = 0;
      local_b0.fds_bits[5] = 0;
      local_b0.fds_bits[6] = 0;
      local_b0.fds_bits[3] = 0;
      local_b0.fds_bits[4] = 0;
      local_b0.fds_bits[1] = 0;
      local_b0.fds_bits[2] = 0;
      local_b0.fds_bits[0xf] = 0;
      local_b0.fds_bits[0] = 1;
      local_b0.fds_bits[childStdoutFd / 0x40] = local_b0.fds_bits[childStdoutFd / 0x40] | uVar5;
      if (childStderrFd != -1) {
        local_b0.fds_bits[childStderrFd / 0x40] = local_b0.fds_bits[childStderrFd / 0x40] | uVar4;
      }
      iVar2 = select(iVar3 + 1,&local_b0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if (iVar2 == -1) goto LAB_0011281a;
      if ((local_b0.fds_bits[0] & 1U) != 0) {
        bVar1 = pump("STDIN",0,childStdinFd);
        if (!bVar1) goto LAB_0011281a;
      }
      if ((local_b0.fds_bits[childStdoutFd / 0x40] & uVar5) != 0) {
        bVar1 = pump("STDOUT",childStdoutFd,1);
        if (!bVar1) goto LAB_0011281a;
      }
    } while ((local_b0.fds_bits[childStderrFd / 0x40] & uVar4) == 0);
    bVar1 = pump("STDERR",childStderrFd,2);
  } while (bVar1);
LAB_0011281a:
  puts("PROCESS FINISHED!");
  return;
}

Assistant:

void
pumpChildStdio(
	int childStdinFd,
	int childStdoutFd,
	int childStderrFd
) {
	int result;
	int tmp = AXL_MAX(childStdoutFd, childStderrFd);
	int selectFd = AXL_MAX(tmp, STDIN_FILENO) + 1;

	for (;;) {
		fd_set readSet = { 0 };

		FD_SET(STDIN_FILENO, &readSet);
		FD_SET(childStdoutFd, &readSet);

		if (childStderrFd != -1)
			FD_SET(childStderrFd, &readSet);

		result = ::select(selectFd, &readSet, NULL, NULL, NULL);
		if (result == -1)
			break;

		if (FD_ISSET(STDIN_FILENO, &readSet))
			if (!pump("STDIN", STDIN_FILENO, childStdinFd))
				break;

		if (FD_ISSET(childStdoutFd, &readSet))
			if (!pump("STDOUT", childStdoutFd, STDOUT_FILENO))
				break;

		if (FD_ISSET(childStderrFd, &readSet))
			if (!pump("STDERR", childStderrFd, STDERR_FILENO))
				break;
	}

	printf("PROCESS FINISHED!\n");
}